

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLEBTensorOp.cpp
# Opt level: O2

void __thiscall
amrex::MLEBTensorOp::apply
          (MLEBTensorOp *this,int amrlev,int mglev,MultiFab *out,MultiFab *in,BCMode bc_mode,
          StateMode s_mode,MLMGBndry *bndry)

{
  FabArray<amrex::FArrayBox> *pFVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  double *pdVar8;
  double *pdVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  int iVar13;
  pointer pVVar14;
  pointer puVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int iVar18;
  Real RVar19;
  FabType FVar20;
  uint uVar21;
  EBFArrayBoxFactory *this_00;
  int *piVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  int iVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  int iVar46;
  long lVar47;
  long lVar48;
  long lVar49;
  int iVar50;
  long lVar51;
  int iVar52;
  ulong uVar53;
  ulong uVar54;
  undefined4 uVar55;
  undefined4 uVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  undefined1 auVar68 [16];
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  double dVar77;
  double dVar78;
  double dVar79;
  double dVar80;
  double dVar81;
  double dVar82;
  double dVar83;
  double dVar84;
  Real dzi;
  Real dyi;
  double local_a48;
  double local_a40;
  FabArray<amrex::EBCellFlagFab> *local_a28;
  Box local_974;
  double local_958;
  undefined8 uStack_950;
  Real dxi;
  undefined8 uStack_940;
  double *local_938;
  double dStack_930;
  double local_928;
  double dStack_920;
  MultiCutFab *local_918;
  FabArray<amrex::FArrayBox> *local_910;
  MLEBTensorOp *local_908;
  FabArray<amrex::FArrayBox> *local_900;
  long local_8f8;
  long local_8f0;
  long local_8e8;
  int *local_8e0;
  int *local_8d8;
  int *local_8d0;
  long local_8c0;
  long local_8b0;
  long local_8a0;
  long local_898;
  long local_880;
  long local_870;
  long local_868;
  long local_850;
  long local_840;
  double *local_838;
  long local_830;
  double *local_828;
  double *local_820;
  double local_818;
  undefined8 uStack_810;
  double local_808;
  undefined8 uStack_800;
  double local_7f8;
  double dStack_7f0;
  Array<const_MultiCutFab_*,_3> local_7e8;
  Array<const_MultiCutFab_*,_3> local_7c8;
  long local_7a8;
  Real dzi_1;
  Real dyi_1;
  FabArray<amrex::FArrayBox> *local_790;
  FabArray<amrex::IArrayBox> *local_788;
  FabArray<amrex::FArrayBox> *local_780;
  FabArray<amrex::FArrayBox> *local_778;
  FabArray<amrex::FArrayBox> *local_770;
  FabArray<amrex::FArrayBox> *local_768;
  long local_760;
  long local_758;
  ulong local_750;
  EBCellFlag *local_748;
  long local_738;
  long local_730;
  int *local_728;
  long local_720;
  long local_718;
  long local_710;
  double *local_708;
  int *local_700;
  double *local_6f8;
  double *local_6f0;
  int *local_6e8;
  long local_6e0;
  ulong local_6d8;
  double *local_6d0;
  double *local_6c8;
  double *local_6c0;
  double *local_6b8;
  long local_6b0;
  long local_6a8;
  long local_6a0;
  long local_690;
  long local_688;
  double *local_680;
  long local_668;
  long local_658;
  long local_650;
  double *local_640;
  double *local_638;
  _Head_base<0UL,_amrex::MultiFab_*,_false> local_630;
  double *local_628;
  long local_620;
  long local_618;
  long local_610;
  long local_608;
  double *local_600;
  double *local_5f8;
  double *local_5f0;
  long local_5e8;
  long local_5e0;
  double *local_5d8;
  double *local_5d0;
  double *local_5c8;
  long local_5c0;
  double local_5b8;
  double local_5b0;
  Array4<const_double> fzfab;
  Array4<const_double> fyfab;
  Array4<const_double> fxfab;
  Array4<double> axfab;
  Array4<const_double> local_4a8;
  double local_468;
  double dStack_460;
  double local_458;
  undefined8 uStack_450;
  MFIter mfi;
  Real dxi_1;
  double dStack_3b0;
  Array4<const_double> local_388;
  Array4<const_double> local_348;
  Array4<const_double> local_308;
  Array4<const_double> local_2c8;
  Array4<const_double> local_288;
  Array4<const_double> local_248;
  Array4<const_double> local_208;
  Array4<const_double> local_1c8;
  Array4<const_double> local_188;
  Array4<const_amrex::EBCellFlag> local_148;
  Array4<const_int> local_108;
  Array4<const_double> local_c8;
  Array4<const_double> local_88;
  MFItInfo local_44;
  
  local_900 = &out->super_FabArray<amrex::FArrayBox>;
  MLEBABecLap::apply(&this->super_MLEBABecLap,amrlev,mglev,out,in,bc_mode,s_mode,bndry);
  lVar39 = (long)mglev;
  lVar35 = (long)amrlev;
  pVVar14 = (this->m_kappa).
            super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
            .
            super__Vector_base<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (lVar39 < ((long)*(pointer *)
                       ((long)&pVVar14[lVar35].
                               super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                               .
                               super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                       + 8) -
               *(long *)&pVVar14[lVar35].
                         super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                         .
                         super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
               ) / 0x480) {
    local_7a8 = lVar35;
    applyBCTensor(this,amrlev,mglev,in,bc_mode,s_mode,bndry);
    lVar23 = *(long *)(*(long *)&(this->super_MLEBABecLap).super_MLCellABecLap.super_MLCellLinOp.
                                 super_MLLinOp.m_factory.
                                 super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                                 .
                                 super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[lVar35].
                                 super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                                 .
                                 super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                      + lVar39 * 8);
    local_908 = this;
    if ((lVar23 == 0) ||
       (this_00 = (EBFArrayBoxFactory *)
                  __dynamic_cast(lVar23,&FabFactory<amrex::FArrayBox>::typeinfo,
                                 &EBFArrayBoxFactory::typeinfo,0),
       this_00 == (EBFArrayBoxFactory *)0x0)) {
      local_7c8._M_elems[2] = (MultiCutFab *)0x0;
      local_7c8._M_elems[0] = (MultiCutFab *)0x0;
      local_7c8._M_elems[1] = (MultiCutFab *)0x0;
      local_7e8._M_elems[2] = (MultiCutFab *)0x0;
      local_7e8._M_elems[0] = (MultiCutFab *)0x0;
      local_7e8._M_elems[1] = (MultiCutFab *)0x0;
      local_910 = (FabArray<amrex::FArrayBox> *)0x0;
      local_a28 = (FabArray<amrex::EBCellFlagFab> *)0x0;
      local_918 = (MultiCutFab *)0x0;
    }
    else {
      local_a28 = EBFArrayBoxFactory::getMultiEBCellFlagFab(this_00);
      local_910 = &EBFArrayBoxFactory::getVolFrac(this_00)->super_FabArray<amrex::FArrayBox>;
      EBFArrayBoxFactory::getAreaFrac(&local_7c8,this_00);
      EBFArrayBoxFactory::getFaceCent(&local_7e8,this_00);
      local_918 = EBFArrayBoxFactory::getBndryCent(this_00);
    }
    lVar23 = *(long *)&(local_908->super_MLEBABecLap).super_MLCellABecLap.super_MLCellLinOp.
                       super_MLLinOp.m_geom.
                       super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                       .
                       super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar35].
                       super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                       super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
    lVar24 = lVar39 * 200;
    dxi = *(Real *)(lVar23 + 0x38 + lVar24);
    uStack_940 = 0;
    dVar10 = *(double *)(lVar23 + 0x40 + lVar24);
    dVar11 = *(double *)(lVar23 + 0x48 + lVar24);
    lVar23 = *(long *)&(local_908->m_tauflux).
                       super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                       .
                       super__Vector_base<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar35].
                       super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                       .
                       super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
    ;
    pFVar1 = (FabArray<amrex::FArrayBox> *)(lVar23 + lVar39 * 0x480);
    local_788 = (FabArray<amrex::IArrayBox> *)
                (*(long *)&(local_908->super_MLEBABecLap).m_cc_mask.
                           super_vector<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>,_std::allocator<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>_>_>
                           .
                           super__Vector_base<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>,_std::allocator<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[lVar35].
                           super_vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>.
                           super__Vector_base<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_> +
                lVar39 * 0x180);
    local_790 = *(FabArray<amrex::FArrayBox> **)
                 (*(long *)&(local_908->super_MLEBABecLap).m_eb_b_coeffs.
                            super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                            .
                            super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar35].
                            super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                            .
                            super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                 + lVar39 * 8);
    local_780 = (FabArray<amrex::FArrayBox> *)
                (lVar39 * 0x180 +
                *(long *)&(local_908->m_eb_kappa).
                          super_vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                          .
                          super__Vector_base<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar35].
                          super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                          super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>);
    dVar12 = (local_908->super_MLEBABecLap).m_b_scalar;
    compCrossTerms(local_908,amrlev,mglev,in);
    local_44.num_streams = Gpu::Device::max_gpu_streams;
    local_44.do_tiling = true;
    local_44.tilesize.vect[0] = (int)FabArrayBase::mfiter_tile_size;
    local_44.tilesize.vect[1] = FabArrayBase::mfiter_tile_size._4_4_;
    local_44.tilesize.vect[2] = DAT_006ddef0;
    local_44.dynamic = true;
    local_44.device_sync = true;
    MFIter::MFIter(&mfi,&local_900->super_FabArrayBase,&local_44);
    RVar19 = dxi;
    local_770 = pFVar1 + 1;
    local_778 = (FabArray<amrex::FArrayBox> *)(lVar23 + 0x300 + lVar39 * 0x480);
    dVar62 = dxi * dVar12;
    dyi_1 = dVar10 * dVar12;
    dzi_1 = dVar11 * dVar12;
    local_768 = pFVar1;
    while (mfi.currentIndex < mfi.endIndex) {
      MFIter::tilebox(&local_974,&mfi);
      if (local_a28 == (FabArray<amrex::EBCellFlagFab> *)0x0) {
        FVar20 = regular;
LAB_005a27ee:
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&axfab,local_900,&mfi);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&fxfab,local_768,&mfi);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&fyfab,local_770,&mfi);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&fzfab,local_778,&mfi);
        if (FVar20 == regular) {
          local_7f8 = (double)(long)local_974.smallend.vect[1];
          lVar39 = (long)local_974.smallend.vect[0] * 8;
          lVar35 = (long)local_974.smallend.vect[2];
          iVar13 = local_974.smallend.vect[2];
          while (iVar13 = iVar13 + 1, (int)lVar35 <= local_974.bigend.vect[2]) {
            lVar23 = (long)fyfab.begin.x;
            lVar29 = (long)fzfab.begin.x;
            lVar31 = (long)axfab.begin.x;
            lVar33 = (lVar35 - axfab.begin.z) * axfab.kstride;
            local_938 = axfab.p + (long)local_974.smallend.vect[0] +
                                  ((lVar33 + axfab.nstride) - lVar31);
            lVar27 = (lVar35 - fzfab.begin.z) * fzfab.kstride * 8;
            lVar32 = (long)(iVar13 - fzfab.begin.z) * fzfab.kstride * 8;
            local_958 = (double)((long)fzfab.p + lVar27 + fzfab.nstride * 8 + lVar29 * -8 + lVar39);
            lVar26 = (lVar35 - fyfab.begin.z) * fyfab.kstride;
            lVar24 = lVar26 * 8 + lVar23 * -8 + lVar39;
            lVar25 = fyfab.nstride * 8 + lVar26 * 8 + lVar23 * -8 + lVar39;
            lVar26 = fyfab.nstride * 0x10 + lVar26 * 8 + lVar23 * -8 + lVar39;
            lVar23 = lVar35 + 1;
            lVar30 = (lVar35 - fxfab.begin.z) * fxfab.kstride;
            lVar28 = (long)fxfab.begin.x;
            dVar61 = local_7f8;
            while (lVar35 = lVar23, (long)dVar61 <= (long)local_974.bigend.vect[1]) {
              if (local_974.bigend.vect[0] < local_974.smallend.vect[0]) {
                dVar61 = (double)((long)dVar61 + 1);
              }
              else {
                lVar40 = ((long)dVar61 - (long)fxfab.begin.y) * fxfab.jstride * 8;
                local_928 = (double)((long)dVar61 + 1);
                lVar43 = ((long)dVar61 - (long)fzfab.begin.y) * fzfab.jstride * 8;
                lVar51 = ((long)dVar61 - (long)axfab.begin.y) * axfab.jstride * 8;
                lVar35 = lVar51 + lVar33 * 8 + lVar31 * -8 + lVar39;
                lVar36 = lVar51 + axfab.nstride * 0x10 + lVar33 * 8 + lVar31 * -8 + lVar39;
                lVar47 = (long)(SUB84(local_928,0) - fyfab.begin.y) * fyfab.jstride * 8;
                lVar42 = ((long)dVar61 - (long)fyfab.begin.y) * fyfab.jstride * 8;
                lVar37 = lVar40 + lVar30 * 8 + lVar28 * -8 + lVar39;
                lVar38 = lVar40 + fxfab.nstride * 8 + lVar30 * 8 + lVar28 * -8 + lVar39;
                lVar40 = lVar40 + fxfab.nstride * 0x10 + lVar30 * 8 + lVar28 * -8 + lVar39;
                lVar48 = 0;
                do {
                  *(double *)((long)axfab.p + lVar48 * 8 + lVar35) =
                       (*(double *)
                         ((long)fzfab.p + lVar48 * 8 + lVar43 + lVar32 + lVar29 * -8 + lVar39) -
                       *(double *)
                        ((long)fzfab.p + lVar48 * 8 + lVar43 + lVar27 + lVar29 * -8 + lVar39)) *
                       dzi_1 + (*(double *)((long)fxfab.p + lVar48 * 8 + lVar37 + 8) -
                               *(double *)((long)fxfab.p + lVar48 * 8 + lVar37)) * dVar62 +
                               (*(double *)((long)fyfab.p + lVar48 * 8 + lVar47 + lVar24) -
                               *(double *)((long)fyfab.p + lVar48 * 8 + lVar42 + lVar24)) * dyi_1 +
                       *(double *)((long)axfab.p + lVar48 * 8 + lVar35);
                  *(double *)((long)local_938 + lVar48 * 8 + lVar51) =
                       (*(double *)
                         ((long)fzfab.p +
                         lVar48 * 8 + lVar43 + lVar32 + fzfab.nstride * 8 + lVar29 * -8 + lVar39) -
                       *(double *)((long)local_958 + lVar43 + lVar48 * 8)) * dzi_1 +
                       (*(double *)((long)fxfab.p + lVar48 * 8 + lVar38 + 8) -
                       *(double *)((long)fxfab.p + lVar48 * 8 + lVar38)) * dVar62 +
                       (*(double *)((long)fyfab.p + lVar48 * 8 + lVar47 + lVar25) -
                       *(double *)((long)fyfab.p + lVar48 * 8 + lVar42 + lVar25)) * dyi_1 +
                       *(double *)((long)local_938 + lVar48 * 8 + lVar51);
                  *(double *)((long)axfab.p + lVar48 * 8 + lVar36) =
                       (*(double *)
                         ((long)fzfab.p +
                         lVar48 * 8 + lVar43 + fzfab.nstride * 0x10 + lVar32 + lVar29 * -8 + lVar39)
                       - *(double *)
                          ((long)fzfab.p +
                          lVar48 * 8 + lVar43 + lVar27 + fzfab.nstride * 0x10 + lVar29 * -8 + lVar39
                          )) * dzi_1 +
                       (*(double *)((long)fxfab.p + lVar48 * 8 + lVar40 + 8) -
                       *(double *)((long)fxfab.p + lVar48 * 8 + lVar40)) * dVar62 +
                       (*(double *)((long)fyfab.p + lVar48 * 8 + lVar47 + lVar26) -
                       *(double *)((long)fyfab.p + lVar48 * 8 + lVar42 + lVar26)) * dyi_1 +
                       *(double *)((long)axfab.p + lVar48 * 8 + lVar36);
                  lVar48 = lVar48 + 1;
                  dVar61 = local_928;
                } while ((local_974.bigend.vect[0] - local_974.smallend.vect[0]) + 1 != (int)lVar48)
                ;
              }
            }
          }
        }
        else {
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_288,&in->super_FabArray<amrex::FArrayBox>,&mfi);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_88,local_790,&mfi);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_c8,local_780,&mfi);
          FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>(&local_108,local_788,&mfi);
          FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>
                    (&local_148,local_a28,&mfi);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_188,local_910,&mfi);
          MultiCutFab::const_array(&local_1c8,local_7c8._M_elems[0],&mfi);
          MultiCutFab::const_array(&local_208,local_7c8._M_elems[1],&mfi);
          MultiCutFab::const_array(&local_248,local_7c8._M_elems[2],&mfi);
          MultiCutFab::const_array(&local_2c8,local_7e8._M_elems[0],&mfi);
          MultiCutFab::const_array(&local_308,local_7e8._M_elems[1],&mfi);
          MultiCutFab::const_array(&local_348,local_7e8._M_elems[2],&mfi);
          MultiCutFab::const_array(&local_388,local_918,&mfi);
          puVar15 = (local_908->super_MLEBABecLap).m_eb_phi.
                    super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                    .
                    super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_630._M_head_impl =
               *(MultiFab **)
                &(puVar15->_M_t).
                 super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
          iVar13 = (local_908->super_MLEBABecLap).m_is_eb_inhomog;
          if (iVar13 == 0 ||
              (tuple<amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>)
              local_630._M_head_impl == (_Head_base<0UL,_amrex::MultiFab_*,_false>)0x0) {
            local_4a8.kstride = 0;
            local_4a8.nstride = 0;
            local_4a8.p = (double *)0x0;
            local_4a8.jstride = 0;
            local_4a8.begin.x = 1;
            local_4a8.begin.y = 1;
            local_4a8.begin.z = 1;
            local_4a8.end.x = 0;
            local_4a8.end.y = 0;
            local_4a8.end.z = 0;
            local_4a8.ncomp = 0;
          }
          else {
            FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (&local_4a8,
                       (FabArray<amrex::FArrayBox> *)
                       puVar15[local_7a8]._M_t.
                       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                       ,&mfi);
          }
          local_8f0 = (long)local_974.smallend.vect[0];
          local_760 = (long)local_974.smallend.vect[1];
          local_750 = (ulong)(uint)local_974.bigend.vect[0];
          local_758 = (long)local_974.bigend.vect[1];
          iVar52 = local_974.smallend.vect[2];
          while (iVar18 = iVar52, iVar18 <= local_974.bigend.vect[2]) {
            local_738 = (long)local_148.begin.y;
            local_8e8 = (long)iVar18;
            local_748 = local_148.p + (local_8e8 - local_148.begin.z) * local_148.kstride;
            local_8f8 = local_8e8 + 1;
            lVar35 = local_760;
            while (iVar52 = (int)local_8f8, lVar35 <= local_758) {
              if (local_974.bigend.vect[0] < local_974.smallend.vect[0]) {
                lVar35 = lVar35 + 1;
              }
              else {
                lVar24 = (lVar35 - local_1c8.begin.y) * local_1c8.jstride;
                lVar36 = (local_8e8 - local_1c8.begin.z) * local_1c8.kstride;
                local_838 = local_2c8.p +
                            (lVar35 - local_2c8.begin.y) * local_2c8.jstride +
                            (local_8e8 - local_2c8.begin.z) * local_2c8.kstride;
                lVar40 = (local_8e8 - local_208.begin.z) * local_208.kstride;
                lVar42 = (lVar35 - local_208.begin.y) * local_208.jstride;
                lVar39 = (local_8e8 - local_308.begin.z) * local_308.kstride;
                local_6b8 = local_308.p + (lVar35 - local_308.begin.y) * local_308.jstride + lVar39;
                local_730 = lVar35 + 1;
                lVar51 = (local_730 - local_208.begin.y) * local_208.jstride;
                local_6c0 = local_308.p +
                            (local_730 - local_308.begin.y) * local_308.jstride + lVar39;
                lVar23 = (iVar18 - fzfab.begin.z) * fzfab.kstride;
                lVar47 = (iVar18 - local_248.begin.z) * local_248.kstride;
                lVar43 = (iVar52 - fzfab.begin.z) * fzfab.kstride;
                lVar25 = (iVar52 - local_248.begin.z) * local_248.kstride;
                lVar39 = (lVar35 - local_348.begin.y) * local_348.jstride;
                local_6c8 = local_348.p +
                            lVar39 + (local_8e8 - local_348.begin.z) * local_348.kstride;
                local_6d0 = local_348.p +
                            lVar39 + (local_8f8 - local_348.begin.z) * local_348.kstride;
                local_5d8 = local_188.p +
                            (lVar35 - local_188.begin.y) * local_188.jstride +
                            (local_8e8 - local_188.begin.z) * local_188.kstride;
                local_708 = local_4a8.p +
                            (lVar35 - local_4a8.begin.y) * local_4a8.jstride +
                            (local_8e8 - local_4a8.begin.z) * local_4a8.kstride;
                local_828 = local_388.p +
                            (lVar35 - local_388.begin.y) * local_388.jstride +
                            (local_8e8 - local_388.begin.z) * local_388.kstride;
                local_638 = local_c8.p +
                            (lVar35 - local_c8.begin.y) * local_c8.jstride +
                            (local_8e8 - local_c8.begin.z) * local_c8.kstride;
                local_640 = local_88.p +
                            (lVar35 - local_88.begin.y) * local_88.jstride +
                            (local_8e8 - local_88.begin.z) * local_88.kstride;
                lVar26 = (lVar35 - axfab.begin.y) * axfab.jstride;
                lVar37 = (local_8e8 - axfab.begin.z) * axfab.kstride;
                lVar27 = (lVar35 - fyfab.begin.y) * fyfab.jstride;
                local_820 = fyfab.p + (local_730 - fyfab.begin.y) * fyfab.jstride;
                lVar28 = lVar35 - local_738;
                local_840 = (long)fxfab.begin.y;
                lVar29 = (lVar35 - local_840) * fxfab.jstride;
                local_850 = (long)fxfab.begin.z;
                local_830 = (iVar18 - fxfab.begin.z) * fxfab.kstride;
                lVar38 = (long)local_108.begin.x;
                local_6d8 = (ulong)(uint)~local_108.begin.x;
                lVar48 = (iVar18 - local_108.begin.z) * local_108.kstride;
                local_868 = (long)local_108.begin.y;
                lVar30 = (lVar35 - local_868) * local_108.jstride;
                local_870 = (long)fyfab.begin.z;
                local_5e0 = (iVar18 - fyfab.begin.z) * fyfab.kstride;
                iVar52 = (int)lVar35;
                local_8d8 = local_108.p + (~local_108.begin.y + iVar52) * local_108.jstride;
                local_8e0 = local_108.p + (local_730 - local_868) * local_108.jstride;
                local_880 = (long)fzfab.begin.y;
                lVar31 = (lVar35 - local_880) * fzfab.jstride;
                local_5d0 = local_248.p + (lVar35 - local_248.begin.y) * local_248.jstride;
                local_898 = (~local_108.begin.z + iVar18) * local_108.kstride;
                local_6e0 = (local_8e8 - local_108.begin.z) * local_108.kstride;
                local_710 = local_4a8.nstride;
                local_718 = local_4a8.nstride * 0x10;
                local_650 = local_388.nstride * 0x10;
                local_658 = (long)local_288.begin.y;
                local_668 = (iVar18 - local_288.begin.z) * local_288.kstride;
                local_680 = local_288.p + (lVar35 - local_658) * local_288.jstride;
                local_5e8 = axfab.nstride * 0x10;
                local_5f0 = fxfab.p + lVar29 + (local_8e8 - local_850) * fxfab.kstride;
                lVar35 = (local_8e8 - local_870) * fyfab.kstride;
                local_5f8 = fyfab.p + ((int)local_730 - fyfab.begin.y) * fyfab.jstride + lVar35;
                local_600 = fyfab.p + lVar27 + lVar35;
                local_608 = (long)fxfab.begin.x;
                local_8a0 = (long)local_2c8.begin.x;
                lVar32 = (long)fyfab.begin.x;
                local_610 = (long)local_208.begin.x;
                local_8b0 = (long)local_308.begin.x;
                local_6e8 = local_8d8 + lVar48;
                local_8d0 = local_108.p + lVar30 + lVar48;
                local_728 = local_8e0 + lVar48;
                lVar33 = (long)fzfab.begin.x;
                local_618 = (long)local_248.begin.x;
                local_8c0 = (long)local_348.begin.x;
                local_6f0 = fzfab.p + lVar31 + lVar23;
                local_6f8 = fzfab.p + lVar31 + lVar43;
                local_700 = local_108.p + lVar30 + local_6e0;
                local_620 = (long)local_188.begin.x;
                local_720 = (long)local_4a8.begin.x;
                local_688 = (long)local_388.begin.x;
                local_690 = (long)local_288.begin.x;
                local_6a0 = local_288.nstride * 2;
                local_6a8 = (long)local_c8.begin.x;
                local_6b0 = (long)local_88.begin.x;
                local_628 = axfab.p + lVar26 + lVar37 + axfab.nstride * 2;
                lVar39 = local_8f0;
                do {
                  uVar21 = local_748[lVar28 * local_148.jstride + (lVar39 - local_148.begin.x)].flag
                           & 3;
                  iVar50 = (int)lVar39;
                  if (uVar21 == 0) {
                    lVar35 = (long)((iVar50 + 1) - fxfab.begin.x);
                    pdVar2 = local_5f0 + (lVar39 - local_608);
                    pdVar3 = local_5f8 + (lVar39 - lVar32);
                    pdVar4 = local_600 + (lVar39 - lVar32);
                    pdVar5 = fzfab.p + lVar31 + (lVar39 - lVar33) + lVar43;
                    pdVar6 = fzfab.p + lVar31 + (lVar39 - lVar33) + lVar23;
                    lVar44 = lVar39 - axfab.begin.x;
                    axfab.p[lVar26 + lVar37 + lVar44] =
                         ((*pdVar5 - *pdVar6) * dVar11 +
                         (local_5f0[lVar35] - *pdVar2) * dxi + (*pdVar3 - *pdVar4) * dVar10) *
                         dVar12 + axfab.p[lVar26 + lVar37 + lVar44];
                    axfab.p[lVar26 + lVar37 + lVar44 + axfab.nstride] =
                         ((pdVar5[fzfab.nstride] - pdVar6[fzfab.nstride]) * dVar11 +
                         (local_5f0[lVar35 + fxfab.nstride] - pdVar2[fxfab.nstride]) * dxi +
                         (pdVar3[fyfab.nstride] - pdVar4[fyfab.nstride]) * dVar10) * dVar12 +
                         axfab.p[lVar26 + lVar37 + lVar44 + axfab.nstride];
                    axfab.p[lVar26 + lVar37 + lVar44 + axfab.nstride * 2] =
                         ((pdVar5[fzfab.nstride * 2] - pdVar6[fzfab.nstride * 2]) * dVar11 +
                         (local_5f0[lVar35 + fxfab.nstride * 2] - pdVar2[fxfab.nstride * 2]) * dxi +
                         (pdVar3[fyfab.nstride * 2] - pdVar4[fyfab.nstride * 2]) * dVar10) * dVar12
                         + axfab.p[lVar26 + lVar37 + lVar44 + axfab.nstride * 2];
                  }
                  else if (uVar21 == 1) {
                    lVar35 = lVar39 - local_608;
                    pdVar2 = fxfab.p + lVar29 + lVar35 + local_830;
                    lVar44 = lVar39 - local_1c8.begin.x;
                    dVar61 = local_1c8.p[lVar24 + lVar36 + lVar44];
                    dVar79 = *pdVar2;
                    dVar82 = pdVar2[fxfab.nstride * 2];
                    dVar84 = pdVar2[fxfab.nstride];
                    if ((0.0 < dVar61) && (dVar61 < 1.0)) {
                      dVar58 = local_838[lVar39 - local_8a0];
                      iVar46 = (-(uint)(dVar58 < 0.0) | 1) + iVar52;
                      dVar57 = (local_838 + (lVar39 - local_8a0))[local_2c8.nstride];
                      lVar41 = (long)(~local_108.begin.x + iVar50);
                      lVar45 = (iVar46 - local_108.begin.y) * local_108.jstride;
                      if ((local_108.p[lVar45 + lVar41 + lVar48] == 0) &&
                         (local_108.p[lVar45 + (lVar39 - lVar38) + lVar48] == 0)) {
                        uVar55 = 0;
                        uVar56 = 0;
                      }
                      else {
                        dVar58 = ABS(dVar58);
                        uVar55 = SUB84(dVar58,0);
                        uVar56 = (undefined4)((ulong)dVar58 >> 0x20);
                      }
                      iVar34 = (-(uint)(dVar57 < 0.0) | 1) + iVar18;
                      lVar45 = (iVar34 - local_108.begin.z) * local_108.kstride;
                      if ((local_108.p[lVar30 + lVar41 + lVar45] == 0) &&
                         (local_108.p[lVar30 + (lVar39 - lVar38) + lVar45] == 0)) {
                        dVar57 = 0.0;
                      }
                      else {
                        dVar57 = ABS(dVar57);
                      }
                      dVar58 = 1.0 - (double)CONCAT44(uVar56,uVar55);
                      dVar63 = dVar58 * (1.0 - dVar57);
                      dVar71 = (1.0 - dVar57) * (double)CONCAT44(uVar56,uVar55);
                      lVar41 = (iVar46 - fxfab.begin.y) * fxfab.jstride;
                      pdVar2 = fxfab.p + lVar41 + lVar35 + local_830;
                      dVar58 = dVar58 * dVar57;
                      lVar45 = (iVar34 - fxfab.begin.z) * fxfab.kstride;
                      pdVar3 = fxfab.p + lVar29 + lVar35 + lVar45;
                      dVar57 = (double)CONCAT44(uVar56,uVar55) * dVar57;
                      pdVar4 = fxfab.p + lVar41 + lVar35 + lVar45;
                      dVar79 = *pdVar4 * dVar57 +
                               *pdVar3 * dVar58 + dVar79 * dVar63 + *pdVar2 * dVar71;
                      dVar82 = pdVar4[fxfab.nstride * 2] * dVar57 +
                               pdVar3[fxfab.nstride * 2] * dVar58 +
                               dVar63 * dVar82 + pdVar2[fxfab.nstride * 2] * dVar71;
                      dVar84 = pdVar4[fxfab.nstride] * dVar57 +
                               pdVar3[fxfab.nstride] * dVar58 +
                               dVar63 * dVar84 + pdVar2[fxfab.nstride] * dVar71;
                    }
                    lVar35 = lVar39 + 1;
                    lVar41 = lVar35 - local_608;
                    pdVar2 = fxfab.p + lVar29 + lVar41 + local_830;
                    lVar45 = lVar35 - local_1c8.begin.x;
                    local_958 = local_1c8.p[lVar24 + lVar36 + lVar45];
                    local_5b0 = *pdVar2;
                    local_7f8 = pdVar2[fxfab.nstride * 2];
                    dStack_7f0 = pdVar2[fxfab.nstride];
                    if ((0.0 < local_958) && (local_958 < 1.0)) {
                      dVar58 = local_838[lVar35 - local_8a0];
                      iVar46 = (-(uint)(dVar58 < 0.0) | 1) + iVar52;
                      dVar57 = (local_838 + (lVar35 - local_8a0))[local_2c8.nstride];
                      lVar49 = (iVar46 - local_108.begin.y) * local_108.jstride;
                      if ((local_108.p[lVar49 + (lVar39 - lVar38) + lVar48] == 0) &&
                         (local_108.p[lVar49 + (lVar35 - lVar38) + lVar48] == 0)) {
                        uVar55 = 0;
                        uVar56 = 0;
                      }
                      else {
                        dVar58 = ABS(dVar58);
                        uVar55 = SUB84(dVar58,0);
                        uVar56 = (undefined4)((ulong)dVar58 >> 0x20);
                      }
                      iVar34 = (-(uint)(dVar57 < 0.0) | 1) + iVar18;
                      lVar49 = (iVar34 - local_108.begin.z) * local_108.kstride;
                      if ((local_108.p[lVar30 + (lVar39 - lVar38) + lVar49] == 0) &&
                         (local_108.p[lVar30 + (lVar35 - lVar38) + lVar49] == 0)) {
                        dVar57 = 0.0;
                      }
                      else {
                        dVar57 = ABS(dVar57);
                      }
                      dVar58 = 1.0 - (double)CONCAT44(uVar56,uVar55);
                      dVar63 = dVar58 * (1.0 - dVar57);
                      dVar71 = (1.0 - dVar57) * (double)CONCAT44(uVar56,uVar55);
                      lVar35 = (iVar46 - fxfab.begin.y) * fxfab.jstride;
                      pdVar2 = fxfab.p + lVar35 + lVar41 + local_830;
                      dVar58 = dVar58 * dVar57;
                      lVar49 = (iVar34 - fxfab.begin.z) * fxfab.kstride;
                      pdVar3 = fxfab.p + lVar29 + lVar41 + lVar49;
                      dVar57 = (double)CONCAT44(uVar56,uVar55) * dVar57;
                      pdVar4 = fxfab.p + lVar35 + lVar41 + lVar49;
                      local_5b0 = *pdVar4 * dVar57 +
                                  *pdVar3 * dVar58 + local_5b0 * dVar63 + *pdVar2 * dVar71;
                      local_7f8 = pdVar4[fxfab.nstride * 2] * dVar57 +
                                  pdVar3[fxfab.nstride * 2] * dVar58 +
                                  dVar63 * local_7f8 + pdVar2[fxfab.nstride * 2] * dVar71;
                      dStack_7f0 = pdVar4[fxfab.nstride] * dVar57 +
                                   pdVar3[fxfab.nstride] * dVar58 +
                                   dVar63 * dStack_7f0 + pdVar2[fxfab.nstride] * dVar71;
                    }
                    lVar35 = lVar39 - lVar32;
                    pdVar2 = fyfab.p + lVar27 + lVar35 + local_5e0;
                    local_5c0 = lVar39 - local_610;
                    local_808 = local_208.p[lVar42 + lVar40 + local_5c0];
                    local_a40 = *pdVar2;
                    local_928 = pdVar2[fyfab.nstride * 2];
                    dStack_920 = pdVar2[fyfab.nstride];
                    uStack_800 = 0;
                    if ((0.0 < local_808) && (local_808 < 1.0)) {
                      dVar58 = local_6b8[lVar39 - local_8b0];
                      iVar46 = (-(uint)(dVar58 < 0.0) | 1) + iVar50;
                      dVar57 = (local_6b8 + (lVar39 - local_8b0))[local_308.nstride];
                      iVar34 = iVar46 - local_108.begin.x;
                      if ((local_6e8[iVar34] == 0) && (local_8d0[iVar34] == 0)) {
                        uVar55 = 0;
                        uVar56 = 0;
                      }
                      else {
                        dVar58 = ABS(dVar58);
                        uVar55 = SUB84(dVar58,0);
                        uVar56 = (undefined4)((ulong)dVar58 >> 0x20);
                      }
                      iVar34 = (-(uint)(dVar57 < 0.0) | 1) + iVar18;
                      lVar41 = (iVar34 - local_108.begin.z) * local_108.kstride;
                      if ((local_8d8[(lVar39 - lVar38) + lVar41] == 0) &&
                         (local_108.p[lVar30 + (lVar39 - lVar38) + lVar41] == 0)) {
                        dVar57 = 0.0;
                      }
                      else {
                        dVar57 = ABS(dVar57);
                      }
                      dVar58 = 1.0 - (double)CONCAT44(uVar56,uVar55);
                      dVar63 = dVar58 * (1.0 - dVar57);
                      dVar71 = (1.0 - dVar57) * (double)CONCAT44(uVar56,uVar55);
                      lVar49 = iVar46 - lVar32;
                      pdVar2 = fyfab.p + lVar27 + lVar49 + local_5e0;
                      dVar58 = dVar58 * dVar57;
                      lVar41 = (iVar34 - fyfab.begin.z) * fyfab.kstride;
                      pdVar3 = fyfab.p + lVar27 + lVar35 + lVar41;
                      dVar57 = (double)CONCAT44(uVar56,uVar55) * dVar57;
                      pdVar4 = fyfab.p + lVar27 + lVar49 + lVar41;
                      local_a40 = *pdVar4 * dVar57 +
                                  *pdVar3 * dVar58 + local_a40 * dVar63 + *pdVar2 * dVar71;
                      local_928 = pdVar4[fyfab.nstride * 2] * dVar57 +
                                  pdVar3[fyfab.nstride * 2] * dVar58 +
                                  dVar63 * local_928 + pdVar2[fyfab.nstride * 2] * dVar71;
                      dStack_920 = pdVar4[fyfab.nstride] * dVar57 +
                                   pdVar3[fyfab.nstride] * dVar58 +
                                   dVar63 * dStack_920 + pdVar2[fyfab.nstride] * dVar71;
                    }
                    pdVar2 = local_820 + lVar35 + local_5e0;
                    dVar58 = local_208.p[lVar51 + lVar40 + local_5c0];
                    local_5b8 = *pdVar2;
                    local_938 = (double *)pdVar2[fyfab.nstride * 2];
                    dStack_930 = pdVar2[fyfab.nstride];
                    if ((0.0 < dVar58) && (dVar58 < 1.0)) {
                      dVar57 = local_6c0[lVar39 - local_8b0];
                      iVar46 = (-(uint)(dVar57 < 0.0) | 1) + iVar50;
                      dVar63 = (local_6c0 + (lVar39 - local_8b0))[local_308.nstride];
                      iVar34 = iVar46 - local_108.begin.x;
                      if ((local_8d0[iVar34] == 0) && (local_728[iVar34] == 0)) {
                        uVar55 = 0;
                        uVar56 = 0;
                      }
                      else {
                        dVar57 = ABS(dVar57);
                        uVar55 = SUB84(dVar57,0);
                        uVar56 = (undefined4)((ulong)dVar57 >> 0x20);
                      }
                      iVar34 = (-(uint)(dVar63 < 0.0) | 1) + iVar18;
                      lVar41 = (iVar34 - local_108.begin.z) * local_108.kstride;
                      if ((local_108.p[lVar30 + (lVar39 - lVar38) + lVar41] == 0) &&
                         (local_8e0[(lVar39 - lVar38) + lVar41] == 0)) {
                        dVar63 = 0.0;
                      }
                      else {
                        dVar63 = ABS(dVar63);
                      }
                      dVar57 = 1.0 - (double)CONCAT44(uVar56,uVar55);
                      dVar71 = dVar57 * (1.0 - dVar63);
                      dVar72 = (1.0 - dVar63) * (double)CONCAT44(uVar56,uVar55);
                      iVar46 = iVar46 - fyfab.begin.x;
                      pdVar2 = local_820 + iVar46 + local_5e0;
                      dVar57 = dVar57 * dVar63;
                      lVar41 = (iVar34 - fyfab.begin.z) * fyfab.kstride;
                      pdVar3 = local_820 + lVar35 + lVar41;
                      dVar63 = (double)CONCAT44(uVar56,uVar55) * dVar63;
                      pdVar4 = local_820 + iVar46 + lVar41;
                      local_5b8 = *pdVar4 * dVar63 +
                                  *pdVar3 * dVar57 + local_5b8 * dVar71 + *pdVar2 * dVar72;
                      local_938 = (double *)
                                  (pdVar4[fyfab.nstride * 2] * dVar63 +
                                  pdVar3[fyfab.nstride * 2] * dVar57 +
                                  dVar71 * (double)local_938 + pdVar2[fyfab.nstride * 2] * dVar72);
                      dStack_930 = pdVar4[fyfab.nstride] * dVar63 +
                                   pdVar3[fyfab.nstride] * dVar57 +
                                   dVar71 * dStack_930 + pdVar2[fyfab.nstride] * dVar72;
                    }
                    lVar35 = lVar39 - lVar33;
                    local_5c8 = local_5d0 + (lVar39 - local_618);
                    dVar57 = local_5c8[lVar47];
                    local_a48 = fzfab.p[lVar31 + lVar35 + lVar23];
                    dVar63 = fzfab.p[lVar31 + lVar35 + lVar23 + fzfab.nstride * 2];
                    dVar71 = fzfab.p[lVar31 + lVar35 + lVar23 + fzfab.nstride];
                    if ((0.0 < dVar57) && (dVar57 < 1.0)) {
                      dVar72 = local_6c8[lVar39 - local_8c0];
                      iVar46 = (-(uint)(dVar72 < 0.0) | 1) + iVar50;
                      dVar59 = (local_6c8 + (lVar39 - local_8c0))[local_348.nstride];
                      lVar41 = (long)(iVar46 - local_108.begin.x);
                      if ((local_108.p[lVar30 + lVar41 + local_898] == 0) &&
                         (local_108.p[lVar30 + lVar41 + lVar48] == 0)) {
                        dVar72 = 0.0;
                      }
                      else {
                        dVar72 = ABS(dVar72);
                      }
                      iVar34 = (-(uint)(dVar59 < 0.0) | 1) + iVar52;
                      lVar41 = (iVar34 - local_868) * local_108.jstride;
                      if ((local_108.p[lVar41 + (lVar39 - lVar38) + local_898] == 0) &&
                         (local_108.p[lVar41 + (lVar39 - lVar38) + lVar48] == 0)) {
                        dVar59 = 0.0;
                      }
                      else {
                        dVar59 = ABS(dVar59);
                      }
                      dVar73 = (1.0 - dVar72) * (1.0 - dVar59);
                      dVar76 = (1.0 - dVar59) * dVar72;
                      lVar49 = iVar46 - lVar33;
                      pdVar2 = local_6f0 + lVar49;
                      dVar64 = (1.0 - dVar72) * dVar59;
                      lVar41 = (iVar34 - fzfab.begin.y) * fzfab.jstride;
                      dVar72 = dVar72 * dVar59;
                      local_a48 = fzfab.p[lVar41 + lVar49 + lVar23] * dVar72 +
                                  fzfab.p[lVar41 + lVar35 + lVar23] * dVar64 +
                                  local_a48 * dVar73 + *pdVar2 * dVar76;
                      dVar63 = fzfab.p[lVar41 + lVar49 + lVar23 + fzfab.nstride * 2] * dVar72 +
                               fzfab.p[lVar41 + lVar35 + lVar23 + fzfab.nstride * 2] * dVar64 +
                               dVar73 * dVar63 + pdVar2[fzfab.nstride * 2] * dVar76;
                      dVar71 = fzfab.p[lVar41 + lVar49 + lVar23 + fzfab.nstride] * dVar72 +
                               fzfab.p[lVar41 + lVar35 + lVar23 + fzfab.nstride] * dVar64 +
                               dVar73 * dVar71 + pdVar2[fzfab.nstride] * dVar76;
                    }
                    dVar72 = local_5c8[lVar25];
                    dVar59 = fzfab.p[lVar31 + lVar35 + lVar43];
                    dVar64 = fzfab.p[lVar31 + lVar35 + lVar43 + fzfab.nstride * 2];
                    dVar73 = fzfab.p[lVar31 + lVar35 + lVar43 + fzfab.nstride];
                    if ((0.0 < dVar72) && (dVar72 < 1.0)) {
                      dVar76 = local_6d0[lVar39 - local_8c0];
                      dVar60 = (local_6d0 + (lVar39 - local_8c0))[local_348.nstride];
                      iVar46 = (-(uint)(dVar60 < 0.0) | 1) + iVar52;
                      iVar34 = (-(uint)(dVar76 < 0.0) | 1) + iVar50;
                      lVar49 = (long)(iVar34 - fzfab.begin.x);
                      pdVar2 = local_6f8 + lVar49;
                      uStack_810 = 0;
                      lVar41 = (iVar46 - fzfab.begin.y) * fzfab.jstride;
                      auVar68._0_4_ = -(uint)(local_700[iVar34 - local_108.begin.x] == 0);
                      auVar68._4_4_ = -(uint)(local_700[iVar34 - local_108.begin.x] == 0);
                      auVar68._8_4_ =
                           -(uint)(local_108.p
                                   [(iVar46 - local_868) * local_108.jstride +
                                    (lVar39 - lVar38) + local_6e0] == 0);
                      auVar68._12_4_ =
                           -(uint)(local_108.p
                                   [(iVar46 - local_868) * local_108.jstride +
                                    (lVar39 - lVar38) + local_6e0] == 0);
                      auVar16._8_8_ = ABS(dVar60);
                      auVar16._0_8_ = ABS(dVar76);
                      dVar65 = SUB168(~auVar68 & auVar16,0);
                      dVar75 = SUB168(~auVar68 & auVar16,8);
                      dVar74 = (1.0 - dVar65) * (1.0 - dVar75);
                      dVar60 = (1.0 - dVar75) * dVar65;
                      dVar76 = (1.0 - dVar65) * dVar75;
                      dVar65 = dVar65 * dVar75;
                      dVar59 = fzfab.p[lVar41 + lVar49 + lVar43] * dVar65 +
                               fzfab.p[lVar41 + lVar35 + lVar43] * dVar76 +
                               dVar59 * dVar74 + *pdVar2 * dVar60;
                      dVar64 = fzfab.p[lVar41 + lVar49 + lVar43 + fzfab.nstride * 2] * dVar65 +
                               fzfab.p[lVar41 + lVar35 + lVar43 + fzfab.nstride * 2] * dVar76 +
                               dVar74 * dVar64 + pdVar2[fzfab.nstride * 2] * dVar60;
                      dVar73 = fzfab.p[lVar41 + lVar49 + lVar43 + fzfab.nstride] * dVar65 +
                               fzfab.p[lVar41 + lVar35 + lVar43 + fzfab.nstride] * dVar76 +
                               dVar74 * dVar73 + pdVar2[fzfab.nstride] * dVar60;
                      local_818 = dVar58;
                    }
                    dVar76 = local_5d8[lVar39 - local_620];
                    if (local_630._M_head_impl == (MultiFab *)0x0) {
                      dVar58 = 0.0;
                      dVar57 = 0.0;
                      dVar61 = 0.0;
                    }
                    else {
                      if (iVar13 == 0) {
                        local_468 = 0.0;
                        dStack_460 = 0.0;
                        local_458 = 0.0;
                      }
                      else {
                        lVar35 = lVar39 - local_720;
                        local_458 = local_708[lVar35];
                        local_468 = local_708[lVar35 + local_4a8.nstride * 2];
                        dStack_460 = local_708[lVar35 + local_4a8.nstride];
                      }
                      uStack_450 = 0;
                      local_958 = local_958 - dVar61;
                      dVar72 = dVar72 - dVar57;
                      dVar58 = dVar58 - local_808;
                      dVar57 = 1.0 / SQRT(dVar72 * dVar72 + local_958 * local_958 + dVar58 * dVar58)
                      ;
                      dVar65 = -local_958 * dVar57;
                      dVar60 = dVar57 * -dVar72;
                      dVar57 = dVar57 * -dVar58;
                      dVar61 = (dVar76 * dVar76 + -0.25) / (dVar76 + dVar76);
                      if (dVar61 <= 0.3) {
                        dVar61 = 0.3;
                      }
                      dVar75 = ABS(dVar57);
                      if (ABS(dVar57) <= ABS(dVar65)) {
                        dVar75 = ABS(dVar65);
                      }
                      dVar74 = ABS(dVar60);
                      if (ABS(dVar60) <= dVar75) {
                        dVar74 = dVar75;
                      }
                      dVar61 = dVar61 / dVar74;
                      lVar35 = lVar39 - local_688;
                      dVar74 = local_828[lVar35] - dVar61 * dVar65;
                      dVar75 = 1.0 / dVar61;
                      auVar17._8_4_ = SUB84(dVar58,0);
                      auVar17._0_8_ = dVar58;
                      auVar17._12_4_ = (int)((ulong)dVar58 >> 0x20);
                      if (dVar65 <= 0.0) {
                        dVar74 = -dVar74;
                      }
                      dVar66 = local_828[lVar35 + local_388.nstride * 2] - dVar61 * dVar60;
                      dVar69 = local_828[lVar35 + local_388.nstride] - dVar61 * dVar57;
                      uVar53 = -(ulong)(0.0 < dVar60);
                      uVar54 = -(ulong)(0.0 < dVar57);
                      dVar61 = (double)(~uVar53 & (ulong)-dVar66 | (ulong)dVar66 & uVar53);
                      dVar69 = (double)(~uVar54 & (ulong)-dVar69 | (ulong)dVar69 & uVar54);
                      dVar67 = dVar74 * dVar61;
                      dVar70 = dVar74 * dVar69;
                      dVar80 = dVar69 * dVar61;
                      dVar78 = dVar70 * dVar61;
                      dVar81 = dVar74 + 1.0 + dVar69 + dVar61 + dVar70 + dVar67 + dVar80 + dVar78;
                      lVar41 = lVar39 - local_690;
                      pdVar2 = local_680 + lVar41 + local_668;
                      dVar66 = ((-dVar61 - dVar67) - dVar80) - dVar78;
                      lVar35 = (int)((((uint)uVar53 | 1) + iVar18) - local_288.begin.z) *
                               local_288.kstride;
                      pdVar3 = local_680 + lVar41 + lVar35;
                      dVar61 = ((-dVar69 - dVar70) - dVar80) - dVar78;
                      lVar49 = (int)((((uint)uVar54 | 1) + iVar52) - local_288.begin.y) *
                               local_288.jstride;
                      pdVar4 = local_288.p + lVar49 + lVar41 + local_668;
                      dVar80 = dVar80 + dVar78;
                      pdVar5 = local_288.p + lVar49 + lVar41 + lVar35;
                      dVar77 = ((-dVar74 - dVar70) - dVar67) - dVar78;
                      lVar41 = (long)(int)(~local_288.begin.x + iVar50 + (uint)(dVar65 <= 0.0) * 2);
                      pdVar6 = local_680 + lVar41 + local_668;
                      dVar67 = dVar67 + dVar78;
                      pdVar7 = local_680 + lVar41 + lVar35;
                      dVar70 = dVar70 + dVar78;
                      pdVar8 = local_288.p + lVar49 + lVar41 + local_668;
                      pdVar9 = local_288.p + lVar49 + lVar41 + lVar35;
                      dVar74 = local_640[lVar39 - local_6b0];
                      dVar83 = (local_458 -
                               ((*pdVar8 * dVar70 +
                                *pdVar7 * dVar67 +
                                *pdVar6 * dVar77 +
                                *pdVar5 * dVar80 +
                                *pdVar4 * dVar61 + *pdVar2 * dVar81 + *pdVar3 * dVar66) -
                               *pdVar9 * dVar78)) * dVar75;
                      dVar69 = dVar75 * (local_468 -
                                        ((pdVar8[local_288.nstride * 2] * dVar70 +
                                         pdVar7[local_288.nstride * 2] * dVar67 +
                                         pdVar6[local_288.nstride * 2] * dVar77 +
                                         pdVar5[local_288.nstride * 2] * dVar80 +
                                         pdVar4[local_288.nstride * 2] * dVar61 +
                                         pdVar2[local_288.nstride * 2] * dVar81 +
                                         pdVar3[local_288.nstride * 2] * dVar66) -
                                        pdVar9[local_288.nstride * 2] * dVar78));
                      dVar75 = dVar75 * (dStack_460 -
                                        ((pdVar8[local_288.nstride] * dVar70 +
                                         pdVar7[local_288.nstride] * dVar67 +
                                         pdVar6[local_288.nstride] * dVar77 +
                                         pdVar5[local_288.nstride] * dVar80 +
                                         pdVar4[local_288.nstride] * dVar61 +
                                         pdVar2[local_288.nstride] * dVar81 +
                                         pdVar3[local_288.nstride] * dVar66) -
                                        pdVar9[local_288.nstride] * dVar78));
                      dVar66 = (dVar74 * -0.6666666666666666 + local_638[lVar39 - local_6a8]) *
                               (dVar65 * dVar83 + dVar75 * dVar57 + dVar69 * dVar60);
                      dStack_3b0 = auVar17._8_8_;
                      dVar61 = (dVar65 * dVar69 * dVar74 * dVar72 +
                               (dVar65 * dVar83 * dVar74 + dVar66) * local_958 +
                               dVar65 * dVar75 * dVar74 * dVar58) * dxi;
                      dVar58 = (dVar72 * (dVar69 * dVar60 * dVar74 + dVar66) +
                               local_958 * dVar74 * dVar83 * dVar60 +
                               dVar58 * dVar75 * dVar60 * dVar74) * RVar19;
                      dVar57 = (dVar72 * dVar57 * dVar69 * dVar74 +
                               local_958 * dVar74 * dVar83 * dVar57 +
                               dStack_3b0 * (dVar75 * dVar57 * dVar74 + dVar66)) * RVar19;
                      local_818 = dVar59;
                      local_808 = dVar76;
                    }
                    uStack_950 = 0;
                    dVar76 = dVar12 / dVar76;
                    lVar35 = lVar39 - axfab.begin.x;
                    axfab.p[lVar26 + lVar37 + lVar35] =
                         (dVar61 * dxi +
                         (dVar59 * local_5c8[lVar25] - local_a48 * local_5c8[lVar47]) * dVar11 +
                         (local_5b0 * local_1c8.p[lVar24 + lVar36 + lVar45] -
                         dVar79 * local_1c8.p[lVar24 + lVar36 + lVar44]) * dxi +
                         (local_5b8 * local_208.p[lVar51 + lVar40 + local_5c0] -
                         local_a40 * local_208.p[lVar42 + lVar40 + local_5c0]) * dVar10) * dVar76 +
                         axfab.p[lVar26 + lVar37 + lVar35];
                    axfab.p[lVar26 + lVar37 + lVar35 + axfab.nstride] =
                         (dVar57 * dxi +
                         (dVar73 * local_5c8[lVar25] - dVar71 * local_5c8[lVar47]) * dVar11 +
                         (dStack_7f0 * local_1c8.p[lVar24 + lVar36 + lVar45] -
                         dVar84 * local_1c8.p[lVar24 + lVar36 + lVar44]) * dxi +
                         (dStack_930 * local_208.p[lVar51 + lVar40 + local_5c0] -
                         dStack_920 * local_208.p[lVar42 + lVar40 + local_5c0]) * dVar10) * dVar76 +
                         axfab.p[lVar26 + lVar37 + lVar35 + axfab.nstride];
                    local_628[lVar35] =
                         (dVar58 * dxi +
                         (dVar64 * local_5c8[lVar25] - dVar63 * local_5c8[lVar47]) * dVar11 +
                         (local_7f8 * local_1c8.p[lVar24 + lVar36 + lVar45] -
                         dVar82 * local_1c8.p[lVar24 + lVar36 + lVar44]) * dxi +
                         ((double)local_938 * local_208.p[lVar51 + lVar40 + local_5c0] -
                         local_928 * local_208.p[lVar42 + lVar40 + local_5c0]) * dVar10) * dVar76 +
                         local_628[lVar35];
                  }
                  lVar39 = lVar39 + 1;
                  lVar35 = local_730;
                } while (local_974.bigend.vect[0] + 1U != (int)lVar39);
              }
            }
          }
        }
      }
      else {
        piVar22 = &mfi.currentIndex;
        if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar22 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start + mfi.currentIndex;
        }
        FVar20 = EBCellFlagFab::getType
                           ((local_a28->m_fabs_v).
                            super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[*piVar22],&local_974);
        if (FVar20 != covered) goto LAB_005a27ee;
      }
      MFIter::operator++(&mfi);
    }
    MFIter::~MFIter(&mfi);
  }
  return;
}

Assistant:

void
MLEBTensorOp::apply (int amrlev, int mglev, MultiFab& out, MultiFab& in, BCMode bc_mode,
                     StateMode s_mode, const MLMGBndry* bndry) const
{
    BL_PROFILE("MLEBTensorOp::apply()");
    MLEBABecLap::apply(amrlev, mglev, out, in, bc_mode, s_mode, bndry);

    if (mglev >= m_kappa[amrlev].size()) return;

    applyBCTensor(amrlev, mglev, in, bc_mode, s_mode, bndry);

    auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[amrlev][mglev].get());
    const FabArray<EBCellFlagFab>* flags = (factory) ? &(factory->getMultiEBCellFlagFab()) : nullptr;
    const MultiFab* vfrac = (factory) ? &(factory->getVolFrac()) : nullptr;
    auto area = (factory) ? factory->getAreaFrac()
        : Array<const MultiCutFab*,AMREX_SPACEDIM>{AMREX_D_DECL(nullptr,nullptr,nullptr)};
    auto fcent = (factory) ? factory->getFaceCent()
        : Array<const MultiCutFab*,AMREX_SPACEDIM>{AMREX_D_DECL(nullptr,nullptr,nullptr)};
    const MultiCutFab* bcent = (factory) ? &(factory->getBndryCent()) : nullptr;

    const Geometry& geom = m_geom[amrlev][mglev];
    const auto dxinv = geom.InvCellSizeArray();

    Array<MultiFab,AMREX_SPACEDIM>& fluxmf = m_tauflux[amrlev][mglev];
    iMultiFab const& mask = m_cc_mask[amrlev][mglev];
    MultiFab const& etaebmf = *m_eb_b_coeffs[amrlev][mglev];
    MultiFab const& kapebmf = m_eb_kappa[amrlev][mglev];
    Real bscalar = m_b_scalar;

    compCrossTerms(amrlev, mglev, in);

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(out, mfi_info); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();

        auto fabtyp = (flags) ? (*flags)[mfi].getType(bx) : FabType::regular;
        if (fabtyp == FabType::covered) continue;

        Array4<Real> const axfab = out.array(mfi);
        AMREX_D_TERM(Array4<Real const> const fxfab = fluxmf[0].const_array(mfi);,
                     Array4<Real const> const fyfab = fluxmf[1].const_array(mfi);,
                     Array4<Real const> const fzfab = fluxmf[2].const_array(mfi););

        if (fabtyp == FabType::regular)
        {
            AMREX_LAUNCH_HOST_DEVICE_LAMBDA ( bx, tbx,
            {
                mltensor_cross_terms(tbx, axfab, AMREX_D_DECL(fxfab,fyfab,fzfab), dxinv, bscalar);
            });
        }
        else
        {
            Array4<Real const> const& vfab = in.const_array(mfi);
            Array4<Real const> const& etab = etaebmf.const_array(mfi);
            Array4<Real const> const& kapb = kapebmf.const_array(mfi);
            Array4<int const> const& ccm = mask.const_array(mfi);
            Array4<EBCellFlag const> const& flag = flags->const_array(mfi);
            Array4<Real const> const& vol = vfrac->const_array(mfi);
            AMREX_D_TERM(Array4<Real const> const& apx = area[0]->const_array(mfi);,
                         Array4<Real const> const& apy = area[1]->const_array(mfi);,
                         Array4<Real const> const& apz = area[2]->const_array(mfi););
            AMREX_D_TERM(Array4<Real const> const& fcx = fcent[0]->const_array(mfi);,
                         Array4<Real const> const& fcy = fcent[1]->const_array(mfi);,
                         Array4<Real const> const& fcz = fcent[2]->const_array(mfi););
            Array4<Real const> const& bc = bcent->const_array(mfi);

            Array4<Real const> foo;
            const bool is_eb_dirichlet =  isEBDirichlet();
            const bool is_eb_inhomog = m_is_eb_inhomog;
            Array4<Real const> const& velbfab = (is_eb_dirichlet && is_eb_inhomog)
                ? m_eb_phi[amrlev]->const_array(mfi) : foo;

            AMREX_LAUNCH_HOST_DEVICE_LAMBDA ( bx, tbx,
            {
                mlebtensor_cross_terms(tbx, axfab,
                                       AMREX_D_DECL(fxfab,fyfab,fzfab),
                                       vfab, velbfab, etab, kapb, ccm, flag, vol,
                                       AMREX_D_DECL(apx,apy,apz),
                                       AMREX_D_DECL(fcx,fcy,fcz),
                                       bc, is_eb_dirichlet, is_eb_inhomog,
                                       dxinv, bscalar);
            });
        }
    }
}